

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

Abc_Cex_t * Saig_ManCbaFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  abctime aVar1;
  Saig_ManCba_t *p;
  Aig_Man_t *pAVar2;
  Vec_Int_t *vReasons;
  Vec_Int_t *p_00;
  abctime aVar3;
  Abc_Cex_t *p_01;
  int level;
  
  Abc_Clock();
  aVar1 = Abc_Clock();
  p = Saig_ManCbaStart(pAig,pCex,nInputs,fVerbose);
  pAVar2 = Saig_ManCbaUnrollWithCex(pAig,pCex,nInputs,&p->vMapPiF2A,&p->vReg2Frame);
  p->pFrames = pAVar2;
  vReasons = Saig_ManCbaFindReason(p);
  if (p->vReg2Frame != (Vec_Vec_t *)0x0) {
    Saig_ManCbaShrink(p);
  }
  if (fVerbose != 0) {
    p_00 = Saig_ManCbaReason2Inputs(p,vReasons);
    printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
           (ulong)(uint)pAVar2->nObjs[2],(ulong)(uint)vReasons->nSize,
           (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)(uint)p_00->nSize);
    Vec_IntFree(p_00);
    level = (int)p_00;
    Abc_Print(level,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
  }
  p_01 = Saig_ManCbaReason2Cex(p,vReasons);
  Vec_IntFree(vReasons);
  Saig_ManCbaStop(p);
  if (fVerbose != 0) {
    printf("Real ");
    Abc_CexPrintStats(pCex);
    printf("Care ");
    Abc_CexPrintStats(p_01);
  }
  Aig_ManCleanMarkAB(pAig);
  return p_01;
}

Assistant:

Abc_Cex_t * Saig_ManCbaFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    Saig_ManCba_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_ManCbaStart( pAig, pCex, nInputs, fVerbose );

//    p->vReg2Frame = Vec_VecStart( pCex->iFrame );
//    p->vReg2Value = Vec_VecStart( pCex->iFrame );
    p->pFrames = Saig_ManCbaUnrollWithCex( pAig, pCex, nInputs, &p->vMapPiF2A, &p->vReg2Frame );
    vReasons = Saig_ManCbaFindReason( p );
    if ( p->vReg2Frame )
        Saig_ManCbaShrink( p );


//if ( fVerbose )
//Aig_ManPrintStats( p->pFrames );

    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_ManCbaReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    pCare = Saig_ManCbaReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_ManCbaStop( p );

if ( fVerbose )
{
printf( "Real " );
Abc_CexPrintStats( pCex );
}
if ( fVerbose )
{
printf( "Care " );
Abc_CexPrintStats( pCare );
}
/*
    // verify the reduced counter-example using ternary simulation
    if ( !Saig_ManCexVerifyUsingTernary( pAig, pCex, pCare ) )
        printf( "Saig_ManCbaFindCexCareBits(): Minimized counter-example verification has failed!!!\n" );
    else if ( fVerbose )
        printf( "Saig_ManCbaFindCexCareBits(): Minimized counter-example verification is successful.\n" );
*/
    Aig_ManCleanMarkAB( pAig );
    return pCare;
}